

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O1

void InitDefaultsscc_info_BoolValue_google_2fprotobuf_2fwrappers_2eproto(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2df5a4,0x2df5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/wrappers.pb.cc"
            );
  _DAT_003d4198 = 0;
  google::protobuf::_BoolValue_default_instance_ = &PTR__BoolValue_003c9ba8;
  DAT_003d41a4 = 0;
  DAT_003d41a0 = 0;
  google::protobuf::internal::OnShutdownRun
            (google::protobuf::internal::DestroyMessage,
             &google::protobuf::_BoolValue_default_instance_);
  return;
}

Assistant:

PROTOBUF_NAMESPACE_CLOSE
static void InitDefaultsscc_info_BoolValue_google_2fprotobuf_2fwrappers_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_BoolValue_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::BoolValue();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::BoolValue::InitAsDefaultInstance();
}